

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O3

void __thiscall SuiteTimeRangeTests::TestisInSameRange::RunImpl(TestisInSameRange *this)

{
  TestResults *pTVar1;
  char cVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_7d0;
  DateTime local_7b0;
  DateTime local_798;
  DateTime local_780;
  DateTime local_768;
  DateTime local_750;
  DateTime local_738;
  DateTime local_720;
  DateTime local_708;
  DateTime local_6f0;
  DateTime local_6d8;
  DateTime local_6c0;
  DateTime local_6a8;
  DateTime local_690;
  DateTime local_678;
  DateTime local_660;
  DateTime local_648;
  DateTime local_630;
  DateTime local_618;
  DateTime local_600;
  DateTime local_5e8;
  DateTime local_5d0;
  DateTime local_5b8;
  DateTime local_5a0;
  DateTime local_588;
  DateTime local_570;
  DateTime local_558;
  DateTime local_540;
  DateTime local_528;
  DateTime local_510;
  DateTime local_4f8;
  DateTime local_4e0;
  DateTime local_4c8;
  DateTime local_4b0;
  DateTime local_498;
  DateTime local_480;
  DateTime local_468;
  DateTime local_450;
  DateTime local_438;
  DateTime local_420;
  DateTime local_408;
  DateTime local_3f0;
  DateTime local_3d8;
  DateTime local_3c0;
  DateTime local_3a8;
  DateTime local_390;
  DateTime local_378;
  DateTime local_360;
  DateTime local_348;
  DateTime local_330;
  DateTime local_318;
  DateTime local_300;
  DateTime local_2e8;
  DateTime local_2d0;
  DateTime local_2b8;
  DateTime local_2a0;
  DateTime local_288;
  DateTime local_270;
  DateTime local_258;
  DateTime local_240;
  DateTime local_228;
  DateTime local_210;
  DateTime local_1f8;
  DateTime local_1e0;
  DateTime local_1c8;
  DateTime local_1b0;
  DateTime local_198;
  DateTime local_180;
  DateTime local_168;
  DateTime local_150;
  DateTime local_138;
  DateTime local_120;
  DateTime local_108;
  DateTime local_f0;
  DateTime local_d8;
  DateTime local_c0;
  DateTime local_a8;
  DateTime local_90;
  DateTime local_78;
  DateTime local_60;
  DateTime local_48;
  
  local_768._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_768.m_date = 0;
  local_768.m_time = 10800000000000;
  local_780._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_780.m_date = 0;
  local_780.m_time = 64800000000000;
  local_798._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_798.m_date = 0x256974;
  local_798.m_time = 36000000000000;
  local_7b0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_7b0.m_date = 0x256974;
  local_7b0.m_time = 36000000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_768,&local_780,&local_798,&local_7b0);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xbb);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  local_708._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_708.m_date = 0;
  local_708.m_time = 10800000000000;
  local_720._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_720.m_date = 0;
  local_720.m_time = 64800000000000;
  local_738._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_738.m_date = 0x256974;
  local_738.m_time = 36000000000000;
  local_750._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_750.m_date = 0x256974;
  local_750.m_time = 36000000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_708,&local_720,&local_738,&local_750);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xbc);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  local_6a8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_6a8.m_date = 0;
  local_6a8.m_time = 10800000000000;
  local_6c0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_6c0.m_date = 0;
  local_6c0.m_time = 64800000000000;
  local_6d8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_6d8.m_date = 0x256974;
  local_6d8.m_time = 36000000000000;
  local_6f0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_6f0.m_date = 0x256974;
  local_6f0.m_time = 39600000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_6a8,&local_6c0,&local_6d8,&local_6f0);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xc1);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  local_648._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_648.m_date = 0;
  local_648.m_time = 10800000000000;
  local_660._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_660.m_date = 0;
  local_660.m_time = 64800000000000;
  local_678._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_678.m_date = 0x256974;
  local_678.m_time = 39600000000000;
  local_690._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_690.m_date = 0x256974;
  local_690.m_time = 36000000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_648,&local_660,&local_678,&local_690);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xc2);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  local_5e8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_5e8.m_date = 0;
  local_5e8.m_time = 10800000000000;
  local_600._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_600.m_date = 0;
  local_600.m_time = 64800000000000;
  local_618._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_618.m_date = 0x256974;
  local_618.m_time = 39600000000000;
  local_630._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_630.m_date = 0x256974;
  local_630.m_time = 36000000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_5e8,&local_600,&local_618,&local_630);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,199);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  local_588._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_588.m_date = 0;
  local_588.m_time = 10800000000000;
  local_5a0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_5a0.m_date = 0;
  local_5a0.m_time = 64800000000000;
  local_5b8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_5b8.m_date = 0x256974;
  local_5b8.m_time = 36000000000000;
  local_5d0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_5d0.m_date = 0x256974;
  local_5d0.m_time = 39600000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_588,&local_5a0,&local_5b8,&local_5d0);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,200);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  local_528._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_528.m_date = 0;
  local_528.m_time = 10800000000000;
  local_540._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_540.m_date = 0;
  local_540.m_time = 64800000000000;
  local_558._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_558.m_date = 0x256974;
  local_558.m_time = 68400000000000;
  local_570._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_570.m_date = 0x256974;
  local_570.m_time = 36000000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_528,&local_540,&local_558,&local_570);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xcd);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"!TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  local_4c8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_4c8.m_date = 0;
  local_4c8.m_time = 10800000000000;
  local_4e0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_4e0.m_date = 0;
  local_4e0.m_time = 64800000000000;
  local_4f8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_4f8.m_date = 0x256974;
  local_4f8.m_time = 36000000000000;
  local_510._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_510.m_date = 0x256974;
  local_510.m_time = 68400000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_4c8,&local_4e0,&local_4f8,&local_510);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xce);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"!TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  local_468._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_468.m_date = 0;
  local_468.m_time = 10800000000000;
  local_480._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_480.m_date = 0;
  local_480.m_time = 64800000000000;
  local_498._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_498.m_date = 0x256974;
  local_498.m_time = 36000000000000;
  local_4b0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_4b0.m_date = 0x256974;
  local_4b0.m_time = 7200000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_468,&local_480,&local_498,&local_4b0);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xd3);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"!TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  local_408._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_408.m_date = 0;
  local_408.m_time = 10800000000000;
  local_420._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_420.m_date = 0;
  local_420.m_time = 64800000000000;
  local_438._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_438.m_date = 0x256974;
  local_438.m_time = 7200000000000;
  local_450._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_450.m_date = 0x256974;
  local_450.m_time = 36000000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_408,&local_420,&local_438,&local_450);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xd4);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"!TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  local_3a8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_3a8.m_date = 0;
  local_3a8.m_time = 64800000000000;
  local_3c0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_3c0.m_date = 0;
  local_3c0.m_time = 10800000000000;
  local_3d8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_3d8.m_date = 0x256974;
  local_3d8.m_time = 68400000000000;
  local_3f0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_3f0.m_date = 0x256974;
  local_3f0.m_time = 72000000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_3a8,&local_3c0,&local_3d8,&local_3f0);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xdd);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  local_348._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_348.m_date = 0;
  local_348.m_time = 64800000000000;
  local_360._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_360.m_date = 0;
  local_360.m_time = 10800000000000;
  local_378._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_378.m_date = 0x256974;
  local_378.m_time = 72000000000000;
  local_390._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_390.m_date = 0x256974;
  local_390.m_time = 68400000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_348,&local_360,&local_378,&local_390);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xde);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  local_2e8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_2e8.m_date = 0;
  local_2e8.m_time = 64800000000000;
  local_300._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_300.m_date = 0;
  local_300.m_time = 10800000000000;
  local_318._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_318.m_date = 0x256974;
  local_318.m_time = 68400000000000;
  local_330._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_330.m_date = 0x256975;
  local_330.m_time = 7200000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_2e8,&local_300,&local_318,&local_330);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xe3);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  local_288._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_288.m_date = 0;
  local_288.m_time = 64800000000000;
  local_2a0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_2a0.m_date = 0;
  local_2a0.m_time = 10800000000000;
  local_2b8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_2b8.m_date = 0x256975;
  local_2b8.m_time = 7200000000000;
  local_2d0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_2d0.m_date = 0x256974;
  local_2d0.m_time = 68400000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_288,&local_2a0,&local_2b8,&local_2d0);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xe4);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  local_228._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_228.m_date = 0;
  local_228.m_time = 64800000000000;
  local_240._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_240.m_date = 0;
  local_240.m_time = 10800000000000;
  local_258._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_258.m_date = 0x256975;
  local_258.m_time = 7200000000000;
  local_270._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_270.m_date = 0x256974;
  local_270.m_time = 68400000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_228,&local_240,&local_258,&local_270);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xe9);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  local_1c8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_1c8.m_date = 0;
  local_1c8.m_time = 64800000000000;
  local_1e0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_1e0.m_date = 0;
  local_1e0.m_time = 10800000000000;
  local_1f8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_1f8.m_date = 0x256974;
  local_1f8.m_time = 68400000000000;
  local_210._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_210.m_date = 0x256975;
  local_210.m_time = 7200000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_1c8,&local_1e0,&local_1f8,&local_210);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xea);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  local_168._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_168.m_date = 0;
  local_168.m_time = 64800000000000;
  local_180._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_180.m_date = 0;
  local_180.m_time = 10800000000000;
  local_198._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_198.m_date = 0x256975;
  local_198.m_time = 75600000000000;
  local_1b0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_1b0.m_date = 0x256974;
  local_1b0.m_time = 72000000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_168,&local_180,&local_198,&local_1b0);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xef);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"!TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  local_108._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_108.m_date = 0;
  local_108.m_time = 64800000000000;
  local_120._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_120.m_date = 0;
  local_120.m_time = 10800000000000;
  local_138._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_138.m_date = 0x256974;
  local_138.m_time = 72000000000000;
  local_150._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_150.m_date = 0x256975;
  local_150.m_time = 75600000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_108,&local_120,&local_138,&local_150);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xf0);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"!TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  local_a8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_a8.m_date = 0;
  local_a8.m_time = 21600000000000;
  local_c0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_c0.m_date = 0;
  local_c0.m_time = 21600000000000;
  local_d8._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_d8.m_date = 0x256f7c;
  local_d8.m_time = 69000000000000;
  local_f0._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_f0.m_date = 0x256f9b;
  local_f0.m_time = 0x3e896f5ff000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_a8,&local_c0,&local_d8,&local_f0);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xf7);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"!TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  local_48._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_48.m_date = 0;
  local_48.m_time = 21600000000000;
  local_60._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_60.m_date = 0;
  local_60.m_time = 21600000000000;
  local_78._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_78.m_date = 0x256f9b;
  local_78.m_time = 0x3e896f5ff000;
  local_90._vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  local_90.m_date = 0x256f7c;
  local_90.m_time = 69000000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_48,&local_60,&local_78,&local_90);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7d0,*ppTVar4,0xf8);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7d0,"!TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  return;
}

Assistant:

TEST(isInSameRange)
{
  // start time is less than end time
  UtcTimeOnly start( 3, 0, 0 );
  UtcTimeOnly end( 18, 0, 0 );

  // same time
  UtcTimeStamp time1( 10, 0, 0, 10, 10, 2000 );
  UtcTimeStamp time2( 10, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // time 2 in same session but greater
  time1 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 11, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // time 2 in same session but less
  time1 = UtcTimeStamp( 11, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // time 1 not in session
  time1 = UtcTimeStamp( 19, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( !TimeRange::isInSameRange( start, end, time2, time1 ) );

  // time 2 not in session
  time1 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 2, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( !TimeRange::isInSameRange( start, end, time2, time1 ) );

  // start time is greater than end time
  start = UtcTimeOnly( 18, 0, 0 );
  end = UtcTimeOnly( 3, 0, 0 );

  // same session same day
  time1 = UtcTimeStamp( 19, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 20, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // same session time 2 is in next day
  time1 = UtcTimeStamp( 19, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 2, 0, 0, 11, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // same session time 1 is in next day
  time1 = UtcTimeStamp( 2, 0, 0, 11, 10, 2000 );
  time2 = UtcTimeStamp( 19, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // time 1 is 25 hours greater than time 2
  time1 = UtcTimeStamp( 21, 0, 0, 11, 10, 2000 );
  time2 = UtcTimeStamp( 20, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( !TimeRange::isInSameRange( start, end, time2, time1 ) );

  // start time is greater than end time
  start = UtcTimeOnly( 6, 0, 0 );
  end = UtcTimeOnly( 6, 0, 0 );
  time1 = UtcTimeStamp( 19, 10, 0, 1, 13, 2004 );
  time2 = UtcTimeStamp( 19, 06, 0, 1, 14, 2004 );
  CHECK( !TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( !TimeRange::isInSameRange( start, end, time2, time1 ) );
}